

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_>::vector
          (vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_> *this,
          vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_> *other)

{
  size_t sVar1;
  
  (this->alloc).memoryResource = (other->alloc).memoryResource;
  this->ptr = (RGB *)0x0;
  this->nAlloc = 0;
  this->nStored = 0;
  sVar1 = other->nStored;
  this->nAlloc = other->nAlloc;
  this->nStored = sVar1;
  this->ptr = other->ptr;
  other->nStored = 0;
  other->ptr = (RGB *)0x0;
  other->nAlloc = 0;
  return;
}

Assistant:

vector(vector &&other) : alloc(other.alloc) {
        nStored = other.nStored;
        nAlloc = other.nAlloc;
        ptr = other.ptr;

        other.nStored = other.nAlloc = 0;
        other.ptr = nullptr;
    }